

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip324_tests.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2b8465::BIP324Test::TestBIP324PacketVector
          (BIP324Test *this,uint32_t in_idx,string *in_priv_ours_hex,string *in_ellswift_ours_hex,
          string *in_ellswift_theirs_hex,bool in_initiating,string *in_contents_hex,
          uint32_t in_multiply,string *in_aad_hex,bool in_ignore,string *mid_send_garbage_hex,
          string *mid_recv_garbage_hex,string *out_session_id_hex,string *out_ciphertext_hex,
          string *out_ciphertext_endswith_hex)

{
  FastRandomContext *this_00;
  long lVar1;
  byte *pbVar2;
  Span<std::byte> output;
  Span<std::byte> output_00;
  Span<std::byte> contents_00;
  bool bVar3;
  readonly_property65 rVar4;
  int iVar5;
  uint32_t uVar6;
  ulong uVar7;
  unsigned_long uVar8;
  check_type cVar17;
  string *psVar9;
  iterator pvVar10;
  undefined7 in_register_00000089;
  iterator pvVar11;
  bool *pbVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  uint32_t i;
  uint uVar16;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  string_view hex_str_02;
  string_view hex_str_03;
  string_view hex_str_04;
  string_view hex_str_05;
  string_view hex_str_06;
  string_view hex_str_07;
  string_view hex_str_08;
  Span<const_std::byte> ellswift;
  Span<const_std::byte> ellswift_00;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  Span<const_std::byte> contents_01;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  Span<const_std::byte> input;
  Span<const_std::byte> input_00;
  Span<const_std::byte> input_01;
  Span<const_std::byte> input_02;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  Span<const_std::byte> aad;
  Span<const_std::byte> aad_00;
  check_type cVar18;
  char *local_bd8;
  char *local_bd0;
  undefined1 *local_bc8;
  undefined1 *local_bc0;
  char *local_bb8;
  char *local_bb0;
  char *local_ba8;
  char *local_ba0;
  undefined1 *local_b98;
  undefined1 *local_b90;
  char *local_b88;
  char *local_b80;
  char *local_b78;
  char *local_b70;
  undefined1 local_b68 [16];
  assertion_result local_b58;
  undefined1 *local_b40;
  undefined1 *local_b38;
  char *local_b30;
  char *local_b28;
  pointer local_b20;
  check_type cStack_b18;
  bool dec_ignore;
  vector<std::byte,_std::allocator<std::byte>_> decrypted;
  vector<std::byte,_std::allocator<std::byte>_> dec_aad;
  char *local_ac8;
  char *local_ac0;
  undefined1 *local_ab8;
  undefined1 *local_ab0;
  char *local_aa8;
  char *local_aa0;
  char *local_a98;
  char *local_a90;
  undefined1 *local_a88;
  undefined1 *local_a80;
  char *local_a78;
  char *local_a70;
  char *local_a68;
  char *local_a60;
  undefined1 *local_a58;
  undefined1 *local_a50;
  char *local_a48;
  char *local_a40;
  char *local_a38;
  char *local_a30;
  undefined1 *local_a28;
  undefined1 *local_a20;
  char *local_a18;
  char *local_a10;
  char *local_a08;
  char *local_a00;
  undefined1 *local_9f8;
  undefined1 *local_9f0;
  char *local_9e8;
  char *local_9e0;
  char *local_9d8;
  char *local_9d0;
  bool dec_ignore_1;
  undefined7 uStack_9c7;
  element_type *local_9c0;
  shared_count sStack_9b8;
  vector<std::byte,_std::allocator<std::byte>_> *local_9b0;
  vector<std::byte,_std::allocator<std::byte>_> to_decrypt;
  undefined1 *local_990;
  undefined1 *local_988;
  char *local_980;
  char *local_978;
  char *local_970;
  char *local_968;
  undefined1 *local_960;
  undefined1 *local_958;
  char *local_950;
  char *local_948;
  char *local_940;
  char *local_938;
  undefined1 *local_930;
  undefined1 *local_928;
  char *local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  undefined1 *local_900;
  undefined1 *local_8f8;
  char *local_8f0;
  char *local_8e8;
  pointer local_8e0;
  check_type cStack_8d8;
  vector<std::byte,_std::allocator<std::byte>_> ciphertext;
  vector<std::byte,_std::allocator<std::byte>_> contents;
  vector<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  dummies;
  char *local_878;
  char *local_870;
  undefined1 *local_868;
  undefined1 *local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  char *local_840;
  undefined1 *local_838;
  undefined1 *local_830;
  char *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  undefined1 *local_808;
  undefined1 *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  char *local_7e0;
  undefined1 *local_7d8;
  undefined1 *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  undefined1 *local_7a8;
  undefined1 *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  undefined1 *local_778;
  undefined1 *local_770;
  char *local_768;
  char *local_760;
  CKey key;
  vector<std::byte,_std::allocator<std::byte>_> out_ciphertext_endswith;
  vector<std::byte,_std::allocator<std::byte>_> out_ciphertext;
  vector<std::byte,_std::allocator<std::byte>_> out_session_id;
  vector<std::byte,_std::allocator<std::byte>_> mid_recv_garbage;
  vector<std::byte,_std::allocator<std::byte>_> mid_send_garbage;
  vector<std::byte,_std::allocator<std::byte>_> in_aad;
  vector<std::byte,_std::allocator<std::byte>_> in_contents;
  vector<std::byte,_std::allocator<std::byte>_> in_ellswift_theirs;
  vector<std::byte,_std::allocator<std::byte>_> in_ellswift_ours;
  vector<unsigned_char,_std::allocator<unsigned_char>_> in_priv_ours;
  BIP324Cipher dec_cipher;
  BIP324Cipher cipher;
  EllSwiftPubKey ellswift_theirs;
  EllSwiftPubKey ellswift_ours;
  
  pvVar10 = (iterator)CONCAT71(in_register_00000089,in_initiating);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hex_str._M_str = (in_priv_ours_hex->_M_dataplus)._M_p;
  hex_str._M_len = in_priv_ours_hex->_M_string_length;
  psVar9 = in_ellswift_theirs_hex;
  ParseHex<unsigned_char>(&in_priv_ours,hex_str);
  hex_str_00._M_str = (in_ellswift_ours_hex->_M_dataplus)._M_p;
  hex_str_00._M_len = in_ellswift_ours_hex->_M_string_length;
  ParseHex<std::byte>(&in_ellswift_ours,hex_str_00);
  hex_str_01._M_str = (in_ellswift_theirs_hex->_M_dataplus)._M_p;
  hex_str_01._M_len = in_ellswift_theirs_hex->_M_string_length;
  ParseHex<std::byte>(&in_ellswift_theirs,hex_str_01);
  hex_str_02._M_str = (in_contents_hex->_M_dataplus)._M_p;
  hex_str_02._M_len = in_contents_hex->_M_string_length;
  ParseHex<std::byte>(&in_contents,hex_str_02);
  hex_str_03._M_str = (in_aad_hex->_M_dataplus)._M_p;
  hex_str_03._M_len = in_aad_hex->_M_string_length;
  ParseHex<std::byte>(&in_aad,hex_str_03);
  hex_str_04._M_str = (mid_send_garbage_hex->_M_dataplus)._M_p;
  hex_str_04._M_len = mid_send_garbage_hex->_M_string_length;
  ParseHex<std::byte>(&mid_send_garbage,hex_str_04);
  hex_str_05._M_str = (mid_recv_garbage_hex->_M_dataplus)._M_p;
  hex_str_05._M_len = mid_recv_garbage_hex->_M_string_length;
  ParseHex<std::byte>(&mid_recv_garbage,hex_str_05);
  hex_str_06._M_str = (out_session_id_hex->_M_dataplus)._M_p;
  hex_str_06._M_len = out_session_id_hex->_M_string_length;
  ParseHex<std::byte>(&out_session_id,hex_str_06);
  hex_str_07._M_str = (out_ciphertext_hex->_M_dataplus)._M_p;
  hex_str_07._M_len = out_ciphertext_hex->_M_string_length;
  ParseHex<std::byte>(&out_ciphertext,hex_str_07);
  hex_str_08._M_str = (out_ciphertext_endswith_hex->_M_dataplus)._M_p;
  hex_str_08._M_len = out_ciphertext_endswith_hex->_M_string_length;
  ParseHex<std::byte>(&out_ciphertext_endswith,hex_str_08);
  key.fCompressed = false;
  key.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
  CKey::
  Set<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&key,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   )in_priv_ours.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )in_priv_ours.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish,true);
  ellswift.m_size =
       (long)in_ellswift_ours.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)in_ellswift_ours.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  ellswift.m_data =
       in_ellswift_ours.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start;
  EllSwiftPubKey::EllSwiftPubKey(&ellswift_ours,ellswift);
  ellswift_00.m_size =
       (long)in_ellswift_theirs.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)in_ellswift_theirs.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  ellswift_00.m_data =
       in_ellswift_theirs.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start;
  EllSwiftPubKey::EllSwiftPubKey(&ellswift_theirs,ellswift_00);
  BIP324Cipher::BIP324Cipher(&cipher,&key,&ellswift_ours);
  local_768 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
  ;
  local_760 = "";
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = pvVar10;
  msg.m_begin = (iterator)psVar9;
  file.m_end = (iterator)0x3d;
  file.m_begin = (iterator)&local_768;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_778,msg);
  _dec_ignore_1 =
       (undefined **)
       (CONCAT71(uStack_9c7,
                 cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
                 super__Optional_payload<FSChaCha20,_true,_false,_false>.
                 super__Optional_payload_base<FSChaCha20>._M_engaged) ^ 1);
  local_9c0 = (element_type *)0x0;
  sStack_9b8.pi_ = (sp_counted_base *)0x0;
  dummies.
  super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_2b6558;
  dummies.
  super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xb5e477;
  dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
  super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>.
  _M_payload.field2[8] = 0;
  dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
  super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>.
  _M_payload._0_8_ = &PTR__lazy_ostream_0113a070;
  dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
  super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>.
  _M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_788 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
  ;
  local_780 = "";
  pvVar10 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
  super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>.
  _M_payload._24_8_ = &dummies;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&dec_ignore_1,(lazy_ostream *)&dec_cipher,1,0,WARN,_cVar18,
             (size_t)&local_788,0x3d);
  boost::detail::shared_count::~shared_count(&sStack_9b8);
  local_798 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
  ;
  local_790 = "";
  local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar11;
  msg_00.m_begin = pvVar10;
  file_00.m_end = (iterator)0x3e;
  file_00.m_begin = (iterator)&local_798;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_7a8,
             msg_00);
  bVar3 = std::operator==(&cipher.m_our_pubkey.m_pubkey,&ellswift_ours.m_pubkey);
  local_9c0 = (element_type *)0x0;
  sStack_9b8.pi_ = (sp_counted_base *)0x0;
  dummies.
  super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xb5e609;
  dummies.
  super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xb5e62f;
  dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
  super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>.
  _M_payload.field2[8] = 0;
  dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
  super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>.
  _M_payload._0_8_ = &PTR__lazy_ostream_0113a070;
  dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
  super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>.
  _M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_7b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
  ;
  local_7b0 = "";
  pvVar10 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
  super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>.
  _M_payload._24_8_ = &dummies;
  dec_ignore_1 = bVar3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&dec_ignore_1,(lazy_ostream *)&dec_cipher,1,0,WARN,_cVar18,
             (size_t)&local_7b8,0x3e);
  boost::detail::shared_count::~shared_count(&sStack_9b8);
  BIP324Cipher::Initialize(&cipher,&ellswift_theirs,in_initiating,false);
  local_7c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
  ;
  local_7c0 = "";
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar11;
  msg_01.m_begin = pvVar10;
  file_01.m_end = (iterator)0x40;
  file_01.m_begin = (iterator)&local_7c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_7d8,
             msg_01);
  local_9c0 = (element_type *)0x0;
  sStack_9b8.pi_ = (sp_counted_base *)0x0;
  dummies.
  super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xb5e471;
  dummies.
  super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xb5e477;
  dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
  super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>.
  _M_payload.field2[8] = 0;
  dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
  super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>.
  _M_payload._0_8_ = &PTR__lazy_ostream_0113a070;
  dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
  super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>.
  _M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_7e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
  ;
  local_7e0 = "";
  pvVar10 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
  super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>.
  _M_payload._24_8_ = &dummies;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&dec_ignore_1,(lazy_ostream *)&dec_cipher,1,0,WARN,_cVar18,
             (size_t)&local_7e8,0x40);
  boost::detail::shared_count::~shared_count(&sStack_9b8);
  local_7f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
  ;
  local_7f0 = "";
  local_808 = &boost::unit_test::basic_cstring<char_const>::null;
  local_800 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar11;
  msg_02.m_begin = pvVar10;
  file_02.m_end = (iterator)0x43;
  file_02.m_begin = (iterator)&local_7f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_808,
             msg_02);
  dummies.
  super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&cipher.m_session_id;
  dummies.
  super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x20;
  dec_ignore_1 = std::ranges::__equal_fn::
                 operator()<const_std::vector<std::byte,_std::allocator<std::byte>_>_&,_Span<const_std::byte>,_std::ranges::equal_to,_std::identity,_std::identity>
                           ((__equal_fn *)&std::ranges::equal,&out_session_id);
  local_9c0 = (element_type *)0x0;
  sStack_9b8.pi_ = (sp_counted_base *)0x0;
  contents.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)anon_var_dwarf_2b65a3;
  contents.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0xb5e4b1;
  dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
  super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>.
  _M_payload.field2[8] = 0;
  dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
  super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>.
  _M_payload._0_8_ = &PTR__lazy_ostream_0113a070;
  dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
  super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>.
  _M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_818 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
  ;
  local_810 = "";
  pvVar10 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
  super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>.
  _M_payload._24_8_ = &contents;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&dec_ignore_1,(lazy_ostream *)&dec_cipher,1,0,WARN,_cVar18,
             (size_t)&local_818,0x43);
  boost::detail::shared_count::~shared_count(&sStack_9b8);
  local_828 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
  ;
  local_820 = "";
  local_838 = &boost::unit_test::basic_cstring<char_const>::null;
  local_830 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar11;
  msg_03.m_begin = pvVar10;
  file_03.m_end = (iterator)0x44;
  file_03.m_begin = (iterator)&local_828;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_838,
             msg_03);
  dummies.
  super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&cipher.m_send_garbage_terminator;
  dummies.
  super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x10;
  dec_ignore_1 = std::ranges::__equal_fn::
                 operator()<const_std::vector<std::byte,_std::allocator<std::byte>_>_&,_Span<const_std::byte>,_std::ranges::equal_to,_std::identity,_std::identity>
                           ((__equal_fn *)&std::ranges::equal,&mid_send_garbage);
  local_9c0 = (element_type *)0x0;
  sStack_9b8.pi_ = (sp_counted_base *)0x0;
  contents.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)anon_var_dwarf_2b65bc;
  contents.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0xb5e4f9;
  dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
  super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>.
  _M_payload.field2[8] = 0;
  dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
  super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>.
  _M_payload._0_8_ = &PTR__lazy_ostream_0113a070;
  dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
  super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>.
  _M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_848 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
  ;
  local_840 = "";
  pvVar10 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
  super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>.
  _M_payload._24_8_ = &contents;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&dec_ignore_1,(lazy_ostream *)&dec_cipher,1,0,WARN,_cVar18,
             (size_t)&local_848,0x44);
  boost::detail::shared_count::~shared_count(&sStack_9b8);
  local_858 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
  ;
  local_850 = "";
  local_868 = &boost::unit_test::basic_cstring<char_const>::null;
  local_860 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar11;
  msg_04.m_begin = pvVar10;
  file_04.m_end = (iterator)0x45;
  file_04.m_begin = (iterator)&local_858;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_868,
             msg_04);
  dummies.
  super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&cipher.m_recv_garbage_terminator;
  dummies.
  super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x10;
  rVar4.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::ranges::__equal_fn::
       operator()<const_std::vector<std::byte,_std::allocator<std::byte>_>_&,_Span<const_std::byte>,_std::ranges::equal_to,_std::identity,_std::identity>
                 ((__equal_fn *)&std::ranges::equal,&mid_recv_garbage);
  _dec_ignore_1 =
       (undefined **)
       CONCAT71(uStack_9c7,rVar4.super_readonly_property<bool>.super_class_property<bool>.value);
  local_9c0 = (element_type *)0x0;
  sStack_9b8.pi_ = (sp_counted_base *)0x0;
  contents.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)anon_var_dwarf_2b65d5;
  contents.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0xb5e544;
  dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
  super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>.
  _M_payload.field2[8] = 0;
  dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
  super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>.
  _M_payload._0_8_ = &PTR__lazy_ostream_0113a070;
  dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
  super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>.
  _M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_878 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
  ;
  local_870 = "";
  dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
  super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>.
  _M_payload._24_8_ = &contents;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&dec_ignore_1,(lazy_ostream *)&dec_cipher,1,0,WARN,_cVar18,
             (size_t)&local_878,0x45);
  boost::detail::shared_count::~shared_count(&sStack_9b8);
  std::
  vector<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  ::vector(&dummies,(ulong)in_idx,(allocator_type *)&dec_cipher);
  for (lVar13 = 0; (ulong)in_idx * 0x18 - lVar13 != 0; lVar13 = lVar13 + 0x18) {
    std::vector<std::byte,_std::allocator<std::byte>_>::resize
              ((vector<std::byte,_std::allocator<std::byte>_> *)
               ((long)&((dummies.
                         super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar13),0x14);
    pbVar2 = *(byte **)((long)&((dummies.
                                 super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar13);
    output.m_size =
         *(long *)((long)&((dummies.
                            super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
                          super__Vector_impl_data._M_finish + lVar13) - (long)pbVar2;
    output.m_data = pbVar2;
    BIP324Cipher::Encrypt
              (&cipher,(Span<const_std::byte>)ZEXT816(0),(Span<const_std::byte>)ZEXT816(0),true,
               output);
  }
  contents.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  contents.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  contents.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  while (bVar3 = in_multiply != 0, in_multiply = in_multiply - 1, bVar3) {
    std::vector<std::byte,std::allocator<std::byte>>::
    insert<__gnu_cxx::__normal_iterator<std::byte_const*,std::vector<std::byte,std::allocator<std::byte>>>,void>
              ((vector<std::byte,std::allocator<std::byte>> *)&contents,
               (const_iterator)
               contents.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                )in_contents.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                )in_contents.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish);
  }
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            (&ciphertext,
             (size_type)
             (contents.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish +
             (0x14 - (long)contents.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_start)),(allocator_type *)&dec_cipher)
  ;
  contents_01.m_size =
       (long)contents.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)contents.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  aad.m_size = in_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish +
               -(long)in_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start;
  local_8e0 = ciphertext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start;
  _cVar17 = (check_type)
            ((long)ciphertext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)ciphertext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start);
  pvVar10 = (iterator)(ulong)in_ignore;
  output_00.m_size = (size_t)_cVar17;
  output_00.m_data =
       ciphertext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start;
  contents_01.m_data =
       contents.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start;
  aad.m_data = in_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
  _cStack_8d8 = _cVar17;
  BIP324Cipher::Encrypt(&cipher,contents_01,aad,in_ignore,output_00);
  if (out_ciphertext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start ==
      out_ciphertext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_920 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_918 = "";
    local_930 = &boost::unit_test::basic_cstring<char_const>::null;
    local_928 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_06.m_end = pvVar10;
    msg_06.m_begin = (iterator)aad.m_size;
    file_06.m_end = (iterator)0x5d;
    file_06.m_begin = (iterator)&local_920;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_930,
               msg_06);
    local_9c0 = (element_type *)0x0;
    sStack_9b8.pi_ = (sp_counted_base *)0x0;
    dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
    super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>
    ._M_payload._24_8_ = &to_decrypt;
    to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_2b65f9;
    to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xb5e595;
    dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
    super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>
    ._M_payload.field2[8] = 0;
    dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
    super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>
    ._M_payload._0_8_ = &PTR__lazy_ostream_0113a070;
    dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
    super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>
    ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_940 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_938 = "";
    pvVar10 = &DAT_00000001;
    pvVar11 = (iterator)0x0;
    dec_ignore_1 = (ulong)((long)out_ciphertext_endswith.
                                 super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)out_ciphertext_endswith.
                                super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                                super__Vector_impl_data._M_start) <=
                   (ulong)((long)ciphertext.
                                 super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)ciphertext.super__Vector_base<std::byte,_std::allocator<std::byte>_>
                                ._M_impl.super__Vector_impl_data._M_start);
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&dec_ignore_1,(lazy_ostream *)&dec_cipher,1,0,WARN,_cVar17,
               (size_t)&local_940,0x5d);
    boost::detail::shared_count::~shared_count(&sStack_9b8);
    local_950 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_948 = "";
    local_960 = &boost::unit_test::basic_cstring<char_const>::null;
    local_958 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_07.m_end = pvVar11;
    msg_07.m_begin = pvVar10;
    file_07.m_end = (iterator)0x5e;
    file_07.m_begin = (iterator)&local_950;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_960,
               msg_07);
    to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         out_ciphertext_endswith.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_finish +
         -(long)out_ciphertext_endswith.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_start;
    to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start =
         ciphertext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_finish +
         -(long)to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish;
    bVar3 = std::ranges::__equal_fn::
            operator()<const_std::vector<std::byte,_std::allocator<std::byte>_>_&,_Span<std::byte>,_std::ranges::equal_to,_std::identity,_std::identity>
                      ((__equal_fn *)&std::ranges::equal);
    _dec_ignore_1 = (undefined **)CONCAT71(uStack_9c7,bVar3);
    local_9c0 = (element_type *)0x0;
    sStack_9b8.pi_ = (sp_counted_base *)0x0;
    dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
    super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>
    ._M_payload._24_8_ = &dec_aad;
    dec_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_2b6612;
    dec_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xb5e5f8;
    dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
    super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>
    ._M_payload.field2[8] = 0;
    dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
    super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>
    ._M_payload._0_8_ = &PTR__lazy_ostream_0113a070;
    dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
    super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>
    ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_970 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_968 = "";
    pvVar10 = &DAT_00000001;
    pbVar12 = (bool *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&dec_ignore_1,(lazy_ostream *)&dec_cipher,1,0,WARN,_cVar17,
               (size_t)&local_970,0x5e);
  }
  else {
    local_8f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_8e8 = "";
    local_900 = &boost::unit_test::basic_cstring<char_const>::null;
    local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_05.m_end = pvVar10;
    msg_05.m_begin = (iterator)aad.m_size;
    file_05.m_end = (iterator)0x5b;
    file_05.m_begin = (iterator)&local_8f0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_900,
               msg_05);
    bVar3 = std::operator==(&out_ciphertext,&ciphertext);
    _dec_ignore_1 = (undefined **)CONCAT71(uStack_9c7,bVar3);
    local_9c0 = (element_type *)0x0;
    sStack_9b8.pi_ = (sp_counted_base *)0x0;
    dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
    super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>
    ._M_payload._24_8_ = &to_decrypt;
    to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_2b65e0;
    to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xb5e561;
    dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
    super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>
    ._M_payload.field2[8] = 0;
    dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
    super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>
    ._M_payload._0_8_ = &PTR__lazy_ostream_0113a070;
    dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>._M_payload.
    super__Optional_payload<FSChaCha20,_true,_false,_false>.super__Optional_payload_base<FSChaCha20>
    ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_910 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_908 = "";
    pvVar10 = &DAT_00000001;
    pbVar12 = (bool *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&dec_ignore_1,(lazy_ostream *)&dec_cipher,1,0,WARN,_cVar17,
               (size_t)&local_910,0x5b);
  }
  boost::detail::shared_count::~shared_count(&sStack_9b8);
  this_00 = &(this->super_BasicTestingSetup).m_rng;
  iVar15 = 0;
  do {
    if (iVar15 == 0xd) {
      std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                (&ciphertext.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
      std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                (&contents.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
      std::
      vector<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
      ::~vector(&dummies);
      BIP324Cipher::~BIP324Cipher(&cipher);
      std::
      unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ::~unique_ptr(&key.keydata);
      std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                (&out_ciphertext_endswith.super__Vector_base<std::byte,_std::allocator<std::byte>_>)
      ;
      std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                (&out_ciphertext.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
      std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                (&out_session_id.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
      std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                (&mid_recv_garbage.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
      std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                (&mid_send_garbage.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
      std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                (&in_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
      std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                (&in_contents.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
      std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                (&in_ellswift_theirs.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
      std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                (&in_ellswift_ours.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&in_priv_ours.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    BIP324Cipher::BIP324Cipher(&dec_cipher,&key,(EllSwiftPubKey *)&ellswift_ours.m_pubkey);
    local_980 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_978 = "";
    local_990 = &boost::unit_test::basic_cstring<char_const>::null;
    local_988 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_08.m_end = pbVar12;
    msg_08.m_begin = pvVar10;
    file_08.m_end = (iterator)0x6c;
    file_08.m_begin = (iterator)&local_980;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_990,
               msg_08);
    to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(CONCAT71(to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_start._1_7_,
                            dec_cipher.m_send_l_cipher.
                            super__Optional_base<FSChaCha20,_false,_false>._M_payload.
                            super__Optional_payload<FSChaCha20,_true,_false,_false>.
                            super__Optional_payload_base<FSChaCha20>._M_engaged) ^ 1);
    to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dec_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_2b662b;
    dec_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xb5e604;
    local_9c0 = (element_type *)((ulong)local_9c0 & 0xffffffffffffff00);
    _dec_ignore_1 = &PTR__lazy_ostream_0113a070;
    sStack_9b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_9b0 = &dec_aad;
    local_9d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_9d0 = "";
    pvVar10 = &DAT_00000001;
    pvVar11 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&to_decrypt,(lazy_ostream *)&dec_ignore_1,1,0,WARN,_cVar17,
               (size_t)&local_9d8,0x6c);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_9e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_9e0 = "";
    local_9f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_9f0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_09.m_end = pvVar11;
    msg_09.m_begin = pvVar10;
    file_09.m_end = (iterator)0x6d;
    file_09.m_begin = (iterator)&local_9e8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_9f8,
               msg_09);
    bVar3 = std::operator==(&dec_cipher.m_our_pubkey.m_pubkey,&ellswift_ours.m_pubkey);
    to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,bVar3);
    to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dec_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_2b6644;
    dec_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xb5e62f;
    local_9c0 = (element_type *)((ulong)local_9c0 & 0xffffffffffffff00);
    _dec_ignore_1 = &PTR__lazy_ostream_0113a070;
    sStack_9b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_9b0 = &dec_aad;
    local_a08 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_a00 = "";
    pvVar10 = &DAT_00000001;
    pvVar11 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&to_decrypt,(lazy_ostream *)&dec_ignore_1,1,0,WARN,_cVar17,
               (size_t)&local_a08,0x6d);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    BIP324Cipher::Initialize(&dec_cipher,&ellswift_theirs,(iVar15 == 1) != in_initiating,true);
    local_a18 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_a10 = "";
    local_a28 = &boost::unit_test::basic_cstring<char_const>::null;
    local_a20 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_10.m_end = pvVar11;
    msg_10.m_begin = pvVar10;
    file_10.m_end = (iterator)0x6f;
    file_10.m_begin = (iterator)&local_a18;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_a28,
               msg_10);
    to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,
                           dec_cipher.m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>
                           ._M_payload.super__Optional_payload<FSChaCha20,_true,_false,_false>.
                           super__Optional_payload_base<FSChaCha20>._M_engaged);
    to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dec_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xb5e5fa;
    dec_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xb5e604;
    local_9c0 = (element_type *)((ulong)local_9c0 & 0xffffffffffffff00);
    _dec_ignore_1 = &PTR__lazy_ostream_0113a070;
    sStack_9b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_9b0 = &dec_aad;
    local_a38 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_a30 = "";
    pvVar10 = &DAT_00000001;
    pvVar11 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&to_decrypt,(lazy_ostream *)&dec_ignore_1,1,0,WARN,_cVar17,
               (size_t)&local_a38,0x6f);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_a48 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_a40 = "";
    local_a58 = &boost::unit_test::basic_cstring<char_const>::null;
    local_a50 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_11.m_end = pvVar11;
    msg_11.m_begin = pvVar10;
    file_11.m_end = (iterator)0x72;
    file_11.m_begin = (iterator)&local_a48;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_a58,
               msg_11);
    dec_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = dec_cipher.m_session_id._M_elems;
    dec_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x20;
    bVar3 = std::ranges::__equal_fn::
            operator()<const_std::vector<std::byte,_std::allocator<std::byte>_>_&,_Span<const_std::byte>,_std::ranges::equal_to,_std::identity,_std::identity>
                      ((__equal_fn *)&std::ranges::equal,&out_session_id,&dec_aad);
    to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,(iVar15 != 1) == bVar3);
    to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    decrypted.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_2b6668;
    decrypted.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xb5e67d;
    local_9c0 = (element_type *)((ulong)local_9c0 & 0xffffffffffffff00);
    _dec_ignore_1 = &PTR__lazy_ostream_0113a070;
    sStack_9b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_9b0 = &decrypted;
    local_a68 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_a60 = "";
    pvVar10 = &DAT_00000001;
    pvVar11 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&to_decrypt,(lazy_ostream *)&dec_ignore_1,1,0,WARN,_cVar17,
               (size_t)&local_a68,0x72);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_a78 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_a70 = "";
    local_a88 = &boost::unit_test::basic_cstring<char_const>::null;
    local_a80 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_12.m_end = pvVar11;
    msg_12.m_begin = pvVar10;
    file_12.m_end = (iterator)0x73;
    file_12.m_begin = (iterator)&local_a78;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_a88,
               msg_12);
    dec_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = dec_cipher.m_send_garbage_terminator._M_elems;
    dec_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x10;
    bVar3 = std::ranges::__equal_fn::
            operator()<const_std::vector<std::byte,_std::allocator<std::byte>_>_&,_Span<const_std::byte>,_std::ranges::equal_to,_std::identity,_std::identity>
                      ((__equal_fn *)&std::ranges::equal,&mid_send_garbage,&dec_aad);
    to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,(iVar15 != 1) == bVar3);
    to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    decrypted.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_2b6681;
    decrypted.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xb5e6d9;
    local_9c0 = (element_type *)((ulong)local_9c0 & 0xffffffffffffff00);
    _dec_ignore_1 = &PTR__lazy_ostream_0113a070;
    sStack_9b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_9b0 = &decrypted;
    local_a98 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_a90 = "";
    pvVar10 = &DAT_00000001;
    pvVar11 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&to_decrypt,(lazy_ostream *)&dec_ignore_1,1,0,WARN,_cVar17,
               (size_t)&local_a98,0x73);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_aa8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_aa0 = "";
    local_ab8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_ab0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_13.m_end = pvVar11;
    msg_13.m_begin = pvVar10;
    file_13.m_end = (iterator)0x74;
    file_13.m_begin = (iterator)&local_aa8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_ab8,
               msg_13);
    dec_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = dec_cipher.m_recv_garbage_terminator._M_elems;
    dec_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x10;
    bVar3 = std::ranges::__equal_fn::
            operator()<const_std::vector<std::byte,_std::allocator<std::byte>_>_&,_Span<const_std::byte>,_std::ranges::equal_to,_std::identity,_std::identity>
                      ((__equal_fn *)&std::ranges::equal,&mid_recv_garbage,&dec_aad);
    to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,(iVar15 != 1) == bVar3);
    to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    decrypted.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_2b669a;
    decrypted.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xb5e738;
    local_9c0 = (element_type *)((ulong)local_9c0 & 0xffffffffffffff00);
    _dec_ignore_1 = &PTR__lazy_ostream_0113a070;
    sStack_9b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_9b0 = &decrypted;
    local_ac8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_ac0 = "";
    pvVar10 = &DAT_00000001;
    pbVar12 = (bool *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&to_decrypt,(lazy_ostream *)&dec_ignore_1,1,0,WARN,_cVar17,
               (size_t)&local_ac8,0x74);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (iVar15 != 0xc || in_idx != 0) {
      uVar16 = 0;
      uVar14 = 0;
      if (iVar15 == 0xc) {
        iVar5 = RandomMixin<FastRandomContext>::randrange<int>
                          (&this_00->super_RandomMixin<FastRandomContext>,0x10);
        uVar14 = 1 << ((byte)iVar5 & 0x1f);
      }
      for (; (uVar14 ^ in_idx) != uVar16; uVar16 = uVar16 + 1) {
        uVar7 = 0;
        if (uVar16 < in_idx) {
          uVar7 = (ulong)uVar16;
        }
        _dec_ignore_1 = (undefined **)((ulong)_dec_ignore_1 & 0xffffffffffffff00);
        input.m_size = 3;
        input.m_data = dummies.
                       super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar7].
                       super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start;
        BIP324Cipher::DecryptLength(&dec_cipher,input);
        aad.m_size = dummies.
                     super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar7].
                     super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start;
        input_00.m_data = aad.m_size + 3;
        input_00.m_size =
             dummies.
             super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar7].
             super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish + (-3 - (long)aad.m_size);
        _cVar17 = CHECK_PRED;
        pvVar10 = (iterator)0x0;
        pbVar12 = &dec_ignore_1;
        BIP324Cipher::Decrypt
                  (&dec_cipher,input_00,(Span<const_std::byte>)ZEXT816(0),pbVar12,
                   (Span<std::byte>)ZEXT816(0));
      }
      std::vector<std::byte,_std::allocator<std::byte>_>::vector(&to_decrypt,&ciphertext);
      if (iVar15 - 2U < 8) {
        uVar8 = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                          (&this_00->super_RandomMixin<FastRandomContext>,
                           (long)to_decrypt.
                                 super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)to_decrypt.
                                 super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                                 super__Vector_impl_data._M_start);
        to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8] =
             to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start[uVar8] ^ (byte)(1 << ((byte)(iVar15 - 2U) & 0x1f));
      }
      input_01.m_size = 3;
      input_01.m_data =
           to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
      uVar6 = BIP324Cipher::DecryptLength(&dec_cipher,input_01);
      std::vector<std::byte,_std::allocator<std::byte>_>::resize(&to_decrypt,(ulong)(uVar6 + 0x14));
      std::vector<std::byte,_std::allocator<std::byte>_>::vector(&dec_aad,&in_aad);
      if (iVar15 == 0xb) {
        _dec_ignore_1 = (undefined **)((ulong)_dec_ignore_1 & 0xffffffffffffff00);
        std::vector<std::byte,_std::allocator<std::byte>_>::emplace_back<std::byte>
                  (&dec_aad,&dec_ignore_1);
LAB_00266a05:
        std::vector<std::byte,_std::allocator<std::byte>_>::vector
                  (&decrypted,(ulong)uVar6,(allocator_type *)&dec_ignore_1);
        dec_ignore = false;
        input_02.m_data =
             to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start + 3;
        input_02.m_size =
             to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish +
             (-3 - (long)to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                         _M_impl.super__Vector_impl_data._M_start);
        aad_00.m_size =
             dec_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish +
             -(long)dec_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_b20 = decrypted.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start;
        _cVar17 = (check_type)
                  ((long)decrypted.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                  (long)decrypted.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start);
        pbVar12 = &dec_ignore;
        contents_00.m_size = (size_t)_cVar17;
        contents_00.m_data =
             decrypted.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
        aad_00.m_data =
             dec_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
        _cStack_b18 = _cVar17;
        bVar3 = BIP324Cipher::Decrypt(&dec_cipher,input_02,aad_00,pbVar12,contents_00);
        local_b30 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
        ;
        local_b28 = "";
        local_b40 = &boost::unit_test::basic_cstring<char_const>::null;
        local_b38 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_14.m_end = pbVar12;
        msg_14.m_begin = (iterator)aad_00.m_size;
        file_14.m_end = (iterator)0x99;
        file_14.m_begin = (iterator)&local_b30;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_b40
                   ,msg_14);
        local_b58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)((iVar15 != 0) != bVar3);
        local_b58.m_message.px = (element_type *)0x0;
        local_b58.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_b68._0_8_ = "dec_ok == !error";
        local_b68._8_8_ = "";
        local_9c0 = (element_type *)((ulong)local_9c0 & 0xffffffffffffff00);
        _dec_ignore_1 = &PTR__lazy_ostream_0113a070;
        sStack_9b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_9b0 = (vector<std::byte,_std::allocator<std::byte>_> *)local_b68;
        local_b78 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
        ;
        local_b70 = "";
        pvVar10 = &DAT_00000001;
        pbVar12 = (bool *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_b58,(lazy_ostream *)&dec_ignore_1,1,0,WARN,_cVar17,(size_t)&local_b78,0x99
                  );
        boost::detail::shared_count::~shared_count(&local_b58.m_message.pn);
        if (bVar3) {
          local_b88 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
          ;
          local_b80 = "";
          local_b98 = &boost::unit_test::basic_cstring<char_const>::null;
          local_b90 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_15.m_end = pbVar12;
          msg_15.m_begin = pvVar10;
          file_15.m_end = (iterator)0x9b;
          file_15.m_begin = (iterator)&local_b88;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,
                     (size_t)&local_b98,msg_15);
          local_b58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)std::operator==(&decrypted,&contents);
          local_b58.m_message.px = (element_type *)0x0;
          local_b58.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_b68._0_8_ = "decrypted == contents";
          local_b68._8_8_ = "";
          local_9c0 = (element_type *)((ulong)local_9c0 & 0xffffffffffffff00);
          _dec_ignore_1 = &PTR__lazy_ostream_0113a070;
          sStack_9b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_9b0 = (vector<std::byte,_std::allocator<std::byte>_> *)local_b68;
          local_ba8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
          ;
          local_ba0 = "";
          pvVar10 = &DAT_00000001;
          pvVar11 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_b58,(lazy_ostream *)&dec_ignore_1,1,0,WARN,_cVar17,(size_t)&local_ba8,
                     0x9b);
          boost::detail::shared_count::~shared_count(&local_b58.m_message.pn);
          local_bb8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
          ;
          local_bb0 = "";
          local_bc8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_bc0 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_16.m_end = pvVar11;
          msg_16.m_begin = pvVar10;
          file_16.m_end = (iterator)0x9c;
          file_16.m_begin = (iterator)&local_bb8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,
                     (size_t)&local_bc8,msg_16);
          local_b58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(dec_ignore == in_ignore);
          local_b58.m_message.px = (element_type *)0x0;
          local_b58.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_b68._0_8_ = "dec_ignore == in_ignore";
          local_b68._8_8_ = "";
          local_9c0 = (element_type *)((ulong)local_9c0 & 0xffffffffffffff00);
          _dec_ignore_1 = &PTR__lazy_ostream_0113a070;
          sStack_9b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_9b0 = (vector<std::byte,_std::allocator<std::byte>_> *)local_b68;
          local_bd8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
          ;
          local_bd0 = "";
          pvVar10 = &DAT_00000001;
          pbVar12 = (bool *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_b58,(lazy_ostream *)&dec_ignore_1,1,0,WARN,_cVar17,(size_t)&local_bd8,
                     0x9c);
          boost::detail::shared_count::~shared_count(&local_b58.m_message.pn);
        }
        std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                  (&decrypted.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
      }
      else {
        if (iVar15 != 10) goto LAB_00266a05;
        if (in_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            in_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_start) {
          iVar5 = RandomMixin<FastRandomContext>::randrange<int>
                            (&this_00->super_RandomMixin<FastRandomContext>,8);
          uVar8 = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                            (&this_00->super_RandomMixin<FastRandomContext>,
                             (long)dec_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)dec_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
          dec_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8] =
               dec_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8] ^ (byte)(1 << ((byte)iVar5 & 0x1f));
          goto LAB_00266a05;
        }
      }
      std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                (&dec_aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
      std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                (&to_decrypt.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
    }
    BIP324Cipher::~BIP324Cipher(&dec_cipher);
    iVar15 = iVar15 + 1;
  } while( true );
}

Assistant:

void TestBIP324PacketVector(
    uint32_t in_idx,
    const std::string& in_priv_ours_hex,
    const std::string& in_ellswift_ours_hex,
    const std::string& in_ellswift_theirs_hex,
    bool in_initiating,
    const std::string& in_contents_hex,
    uint32_t in_multiply,
    const std::string& in_aad_hex,
    bool in_ignore,
    const std::string& mid_send_garbage_hex,
    const std::string& mid_recv_garbage_hex,
    const std::string& out_session_id_hex,
    const std::string& out_ciphertext_hex,
    const std::string& out_ciphertext_endswith_hex)
{
    // Convert input from hex to char/byte vectors/arrays.
    const auto in_priv_ours = ParseHex(in_priv_ours_hex);
    const auto in_ellswift_ours = ParseHex<std::byte>(in_ellswift_ours_hex);
    const auto in_ellswift_theirs = ParseHex<std::byte>(in_ellswift_theirs_hex);
    const auto in_contents = ParseHex<std::byte>(in_contents_hex);
    const auto in_aad = ParseHex<std::byte>(in_aad_hex);
    const auto mid_send_garbage = ParseHex<std::byte>(mid_send_garbage_hex);
    const auto mid_recv_garbage = ParseHex<std::byte>(mid_recv_garbage_hex);
    const auto out_session_id = ParseHex<std::byte>(out_session_id_hex);
    const auto out_ciphertext = ParseHex<std::byte>(out_ciphertext_hex);
    const auto out_ciphertext_endswith = ParseHex<std::byte>(out_ciphertext_endswith_hex);

    // Load keys
    CKey key;
    key.Set(in_priv_ours.begin(), in_priv_ours.end(), true);
    EllSwiftPubKey ellswift_ours(in_ellswift_ours);
    EllSwiftPubKey ellswift_theirs(in_ellswift_theirs);

    // Instantiate encryption BIP324 cipher.
    BIP324Cipher cipher(key, ellswift_ours);
    BOOST_CHECK(!cipher);
    BOOST_CHECK(cipher.GetOurPubKey() == ellswift_ours);
    cipher.Initialize(ellswift_theirs, in_initiating);
    BOOST_CHECK(cipher);

    // Compare session variables.
    BOOST_CHECK(std::ranges::equal(out_session_id, cipher.GetSessionID()));
    BOOST_CHECK(std::ranges::equal(mid_send_garbage, cipher.GetSendGarbageTerminator()));
    BOOST_CHECK(std::ranges::equal(mid_recv_garbage, cipher.GetReceiveGarbageTerminator()));

    // Vector of encrypted empty messages, encrypted in order to seek to the right position.
    std::vector<std::vector<std::byte>> dummies(in_idx);

    // Seek to the numbered packet.
    for (uint32_t i = 0; i < in_idx; ++i) {
        dummies[i].resize(cipher.EXPANSION);
        cipher.Encrypt({}, {}, true, dummies[i]);
    }

    // Construct contents and encrypt it.
    std::vector<std::byte> contents;
    for (uint32_t i = 0; i < in_multiply; ++i) {
        contents.insert(contents.end(), in_contents.begin(), in_contents.end());
    }
    std::vector<std::byte> ciphertext(contents.size() + cipher.EXPANSION);
    cipher.Encrypt(contents, in_aad, in_ignore, ciphertext);

    // Verify ciphertext. Note that the test vectors specify either out_ciphertext (for short
    // messages) or out_ciphertext_endswith (for long messages), so only check the relevant one.
    if (!out_ciphertext.empty()) {
        BOOST_CHECK(out_ciphertext == ciphertext);
    } else {
        BOOST_CHECK(ciphertext.size() >= out_ciphertext_endswith.size());
        BOOST_CHECK(std::ranges::equal(out_ciphertext_endswith, Span{ciphertext}.last(out_ciphertext_endswith.size())));
    }

    for (unsigned error = 0; error <= 12; ++error) {
        // error selects a type of error introduced:
        // - error=0: no errors, decryption should be successful
        // - error=1: wrong side
        // - error=2..9: bit error in ciphertext
        // - error=10: bit error in aad
        // - error=11: extra 0x00 at end of aad
        // - error=12: message index wrong

        // Instantiate self-decrypting BIP324 cipher.
        BIP324Cipher dec_cipher(key, ellswift_ours);
        BOOST_CHECK(!dec_cipher);
        BOOST_CHECK(dec_cipher.GetOurPubKey() == ellswift_ours);
        dec_cipher.Initialize(ellswift_theirs, (error == 1) ^ in_initiating, /*self_decrypt=*/true);
        BOOST_CHECK(dec_cipher);

        // Compare session variables.
        BOOST_CHECK(std::ranges::equal(out_session_id, dec_cipher.GetSessionID()) == (error != 1));
        BOOST_CHECK(std::ranges::equal(mid_send_garbage, dec_cipher.GetSendGarbageTerminator()) == (error != 1));
        BOOST_CHECK(std::ranges::equal(mid_recv_garbage, dec_cipher.GetReceiveGarbageTerminator()) == (error != 1));

        // Seek to the numbered packet.
        if (in_idx == 0 && error == 12) continue;
        uint32_t dec_idx = in_idx ^ (error == 12 ? (1U << m_rng.randrange(16)) : 0);
        for (uint32_t i = 0; i < dec_idx; ++i) {
            unsigned use_idx = i < in_idx ? i : 0;
            bool dec_ignore{false};
            dec_cipher.DecryptLength(Span{dummies[use_idx]}.first(cipher.LENGTH_LEN));
            dec_cipher.Decrypt(Span{dummies[use_idx]}.subspan(cipher.LENGTH_LEN), {}, dec_ignore, {});
        }

        // Construct copied (and possibly damaged) copy of ciphertext.
        // Decrypt length
        auto to_decrypt = ciphertext;
        if (error >= 2 && error <= 9) {
            to_decrypt[m_rng.randrange(to_decrypt.size())] ^= std::byte(1U << (error - 2));
        }

        // Decrypt length and resize ciphertext to accommodate.
        uint32_t dec_len = dec_cipher.DecryptLength(MakeByteSpan(to_decrypt).first(cipher.LENGTH_LEN));
        to_decrypt.resize(dec_len + cipher.EXPANSION);

        // Construct copied (and possibly damaged) copy of aad.
        auto dec_aad = in_aad;
        if (error == 10) {
            if (in_aad.size() == 0) continue;
            dec_aad[m_rng.randrange(dec_aad.size())] ^= std::byte(1U << m_rng.randrange(8));
        }
        if (error == 11) dec_aad.push_back({});

        // Decrypt contents.
        std::vector<std::byte> decrypted(dec_len);
        bool dec_ignore{false};
        bool dec_ok = dec_cipher.Decrypt(Span{to_decrypt}.subspan(cipher.LENGTH_LEN), dec_aad, dec_ignore, decrypted);

        // Verify result.
        BOOST_CHECK(dec_ok == !error);
        if (dec_ok) {
            BOOST_CHECK(decrypted == contents);
            BOOST_CHECK(dec_ignore == in_ignore);
        }
    }
}